

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O2

void __thiscall ccd::Json::Value::Value(Value *this,string *value)

{
  this->m_type = String;
  std::__detail::__variant::
  _Variant_storage<false,int,double,bool,std::__cxx11::string,std::map<std::__cxx11::string,ccd::Json::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ccd::Json::Value>>>,std::vector<ccd::Json::Value,std::allocator<ccd::Json::Value>>>
  ::_Variant_storage<3ul,std::__cxx11::string_const&>
            ((_Variant_storage<false,int,double,bool,std::__cxx11::string,std::map<std::__cxx11::string,ccd::Json::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ccd::Json::Value>>>,std::vector<ccd::Json::Value,std::allocator<ccd::Json::Value>>>
              *)&this->m_value);
  return;
}

Assistant:

Value::Value ( const std::string& value ) : m_type ( Type::String ), m_value ( value ) {}